

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub_test.c
# Opt level: O0

void test_sub_multi_context(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_msg *pnVar4;
  void *pvVar5;
  char *pcVar6;
  nng_err result__24;
  nng_err result__23;
  nng_err result__22;
  nng_err result__21;
  nng_err result__20;
  nng_err result__19;
  nng_err result__18;
  nng_err result__17;
  nng_err result__16;
  nng_err result__15;
  nng_err result__14;
  nng_err result__13;
  nng_err result__12;
  nng_err result__11;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_msg *m;
  nng_aio *aio2;
  nng_aio *aio1;
  nng_ctx c2;
  nng_ctx c1;
  nng_socket pub;
  nng_socket sub;
  
  nVar1 = nng_sub0_open((nng_socket *)&c1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1ed,"%s: expected success, got %s (%d)","nng_sub0_open(&sub)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_pub0_open((nng_socket *)&c2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1ee,"%s: expected success, got %s (%d)","nng_pub0_open(&pub)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_aio_alloc(&aio2,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1ef,"%s: expected success, got %s (%d)",
                         "nng_aio_alloc(&aio1, NULL, NULL)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_aio_alloc((nng_aio **)&m,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1f0,"%s: expected success, got %s (%d)",
                         "nng_aio_alloc(&aio2, NULL, NULL)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_ctx_open((nng_ctx *)((long)&aio1 + 4),(nng_socket)c1.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1f1,"%s: expected success, got %s (%d)","nng_ctx_open(&c1, sub)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_ctx_open((nng_ctx *)&aio1,(nng_socket)c1.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1f2,"%s: expected success, got %s (%d)","nng_ctx_open(&c2, sub)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_sub0_ctx_subscribe(aio1._4_4_,"one",3);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,500,"%s: expected success, got %s (%d)",
                         "nng_sub0_ctx_subscribe(c1, \"one\", 3)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_sub0_ctx_subscribe(aio1._4_4_,"all",3);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1f5,"%s: expected success, got %s (%d)",
                         "nng_sub0_ctx_subscribe(c1, \"all\", 3)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_sub0_ctx_subscribe(aio1._0_4_,"two",3);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1f7,"%s: expected success, got %s (%d)",
                         "nng_sub0_ctx_subscribe(c2, \"two\", 3)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_sub0_ctx_subscribe(aio1._0_4_,"all",3);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1f8,"%s: expected success, got %s (%d)",
                         "nng_sub0_ctx_subscribe(c2, \"all\", 3)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_aio_set_timeout(aio2,100);
  nng_aio_set_timeout((nng_aio *)m,100);
  nVar1 = nuts_marry((nng_socket)c2.id,(nng_socket)c1.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1fd,"%s: expected success, got %s (%d)","nuts_marry(pub, sub)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_send((nng_socket)c2.id,"one for the money",0x12,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1ff,"%s: expected success, got %s (%d)",
                         "nng_send(pub, \"one for the money\", strlen(\"one for the money\") + 1, 0)"
                         ,pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_send((nng_socket)c2.id,"all dogs go to heaven",0x16,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x200,"%s: expected success, got %s (%d)",
                         "nng_send(pub, \"all dogs go to heaven\", strlen(\"all dogs go to heaven\") + 1, 0)"
                         ,pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_send((nng_socket)c2.id,"nobody likes a snitch",0x16,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x201,"%s: expected success, got %s (%d)",
                         "nng_send(pub, \"nobody likes a snitch\", strlen(\"nobody likes a snitch\") + 1, 0)"
                         ,pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_send((nng_socket)c2.id,"two for the show",0x11,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x202,"%s: expected success, got %s (%d)",
                         "nng_send(pub, \"two for the show\", strlen(\"two for the show\") + 1, 0)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_ctx_recv(aio1._4_4_,aio2);
  nng_aio_wait(aio2);
  nVar1 = nng_aio_result(aio2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x206,"%s: expected success, got %s (%d)","nng_aio_result(aio1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  pnVar4 = nng_aio_get_msg(aio2);
  pcVar3 = (char *)nng_msg_body(pnVar4);
  iVar2 = strcmp(pcVar3,"one for the money");
  pvVar5 = nng_msg_body(pnVar4);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                 ,0x208,"%s == %s",pvVar5,"one for the money");
  nng_msg_free(pnVar4);
  nng_ctx_recv(aio1._4_4_,aio2);
  nng_aio_wait(aio2);
  nVar1 = nng_aio_result(aio2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x20d,"%s: expected success, got %s (%d)","nng_aio_result(aio1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  pnVar4 = nng_aio_get_msg(aio2);
  pcVar3 = (char *)nng_msg_body(pnVar4);
  iVar2 = strcmp(pcVar3,"all dogs go to heaven");
  pvVar5 = nng_msg_body(pnVar4);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                 ,0x20f,"%s == %s",pvVar5,"all dogs go to heaven");
  nng_msg_free(pnVar4);
  nng_ctx_recv(aio1._0_4_,aio2);
  nng_aio_wait(aio2);
  nVar1 = nng_aio_result(aio2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x214,"%s: expected success, got %s (%d)","nng_aio_result(aio1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  pnVar4 = nng_aio_get_msg(aio2);
  pcVar3 = (char *)nng_msg_body(pnVar4);
  iVar2 = strcmp(pcVar3,"all dogs go to heaven");
  pvVar5 = nng_msg_body(pnVar4);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                 ,0x216,"%s == %s",pvVar5,"all dogs go to heaven");
  nng_msg_free(pnVar4);
  nng_ctx_recv(aio1._0_4_,aio2);
  nng_aio_wait(aio2);
  nVar1 = nng_aio_result(aio2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x21b,"%s: expected success, got %s (%d)","nng_aio_result(aio1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  pnVar4 = nng_aio_get_msg(aio2);
  pcVar3 = (char *)nng_msg_body(pnVar4);
  iVar2 = strcmp(pcVar3,"two for the show");
  pvVar5 = nng_msg_body(pnVar4);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                 ,0x21d,"%s == %s",pvVar5,"two for the show");
  nng_msg_free(pnVar4);
  nng_ctx_recv(aio1._4_4_,aio2);
  nng_ctx_recv(aio1._0_4_,(nng_aio *)m);
  nng_aio_wait(aio2);
  nng_aio_wait((nng_aio *)m);
  nVar1 = nng_aio_result(aio2);
  pcVar3 = nng_strerror(NNG_ETIMEDOUT);
  acutest_check_((uint)(nVar1 == NNG_ETIMEDOUT),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                 ,0x225,"%s fails with %s","nng_aio_result(aio1)",pcVar3);
  pcVar3 = nng_strerror(NNG_ETIMEDOUT);
  pcVar6 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio1)",pcVar3,5,pcVar6,
                   (ulong)nVar1);
  nVar1 = nng_aio_result((nng_aio *)m);
  pcVar3 = nng_strerror(NNG_ETIMEDOUT);
  acutest_check_((uint)(nVar1 == NNG_ETIMEDOUT),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                 ,0x226,"%s fails with %s","nng_aio_result(aio2)",pcVar3);
  pcVar3 = nng_strerror(NNG_ETIMEDOUT);
  pcVar6 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio2)",pcVar3,5,pcVar6,
                   (ulong)nVar1);
  nVar1 = nng_sub0_ctx_unsubscribe(aio1._0_4_,"two",3);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x228,"%s: expected success, got %s (%d)",
                         "nng_sub0_ctx_unsubscribe(c2, \"two\", 3)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_sub0_ctx_unsubscribe(aio1._0_4_,"all",3);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x229,"%s: expected success, got %s (%d)",
                         "nng_sub0_ctx_unsubscribe(c2, \"all\", 3)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_close((nng_socket)c1.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x22b,"%s: expected success, got %s (%d)","nng_socket_close(sub)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_close((nng_socket)c2.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x22c,"%s: expected success, got %s (%d)","nng_socket_close(pub)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_aio_free(aio2);
  nng_aio_free((nng_aio *)m);
  return;
}

Assistant:

static void
test_sub_multi_context(void)
{
	nng_socket sub;
	nng_socket pub;
	nng_ctx    c1;
	nng_ctx    c2;
	nng_aio   *aio1;
	nng_aio   *aio2;
	nng_msg   *m;

	NUTS_PASS(nng_sub0_open(&sub));
	NUTS_PASS(nng_pub0_open(&pub));
	NUTS_PASS(nng_aio_alloc(&aio1, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&aio2, NULL, NULL));
	NUTS_PASS(nng_ctx_open(&c1, sub));
	NUTS_PASS(nng_ctx_open(&c2, sub));

	NUTS_PASS(nng_sub0_ctx_subscribe(c1, "one", 3));
	NUTS_PASS(nng_sub0_ctx_subscribe(c1, "all", 3));

	NUTS_PASS(nng_sub0_ctx_subscribe(c2, "two", 3));
	NUTS_PASS(nng_sub0_ctx_subscribe(c2, "all", 3));

	nng_aio_set_timeout(aio1, 100);
	nng_aio_set_timeout(aio2, 100);

	NUTS_MARRY(pub, sub);

	NUTS_SEND(pub, "one for the money");
	NUTS_SEND(pub, "all dogs go to heaven");
	NUTS_SEND(pub, "nobody likes a snitch");
	NUTS_SEND(pub, "two for the show");

	nng_ctx_recv(c1, aio1);
	nng_aio_wait(aio1);
	NUTS_PASS(nng_aio_result(aio1));
	m = nng_aio_get_msg(aio1);
	NUTS_MATCH(nng_msg_body(m), "one for the money");
	nng_msg_free(m);

	nng_ctx_recv(c1, aio1);
	nng_aio_wait(aio1);
	NUTS_PASS(nng_aio_result(aio1));
	m = nng_aio_get_msg(aio1);
	NUTS_MATCH(nng_msg_body(m), "all dogs go to heaven");
	nng_msg_free(m);

	nng_ctx_recv(c2, aio1);
	nng_aio_wait(aio1);
	NUTS_PASS(nng_aio_result(aio1));
	m = nng_aio_get_msg(aio1);
	NUTS_MATCH(nng_msg_body(m), "all dogs go to heaven");
	nng_msg_free(m);

	nng_ctx_recv(c2, aio1);
	nng_aio_wait(aio1);
	NUTS_PASS(nng_aio_result(aio1));
	m = nng_aio_get_msg(aio1);
	NUTS_MATCH(nng_msg_body(m), "two for the show");
	nng_msg_free(m);

	nng_ctx_recv(c1, aio1);
	nng_ctx_recv(c2, aio2);

	nng_aio_wait(aio1);
	nng_aio_wait(aio2);
	NUTS_FAIL(nng_aio_result(aio1), NNG_ETIMEDOUT);
	NUTS_FAIL(nng_aio_result(aio2), NNG_ETIMEDOUT);

	NUTS_PASS(nng_sub0_ctx_unsubscribe(c2, "two", 3));
	NUTS_PASS(nng_sub0_ctx_unsubscribe(c2, "all", 3));

	NUTS_CLOSE(sub);
	NUTS_CLOSE(pub);
	nng_aio_free(aio1);
	nng_aio_free(aio2);
}